

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse_off_ext(Datetime *this,Pig *pig)

{
  bool bVar1;
  int iVar2;
  uint c;
  size_type previous;
  int iVar3;
  Datetime *pDVar4;
  int iVar5;
  int minute;
  int hour;
  int local_30;
  int local_2c;
  
  previous = Pig::cursor(pig);
  iVar2 = Pig::peek(pig);
  if ((iVar2 == 0x2d) || (iVar2 == 0x2b)) {
    pDVar4 = (Datetime *)pig;
    Pig::skipN(pig,1);
    iVar5 = 0;
    local_2c = 0;
    local_30 = 0;
    bVar1 = parse_off_hour(pDVar4,pig,&local_2c);
    if (bVar1) {
      pDVar4 = (Datetime *)pig;
      bVar1 = Pig::skip(pig,0x3a);
      if (bVar1) {
        bVar1 = parse_off_minute(pDVar4,pig,&local_30);
        if (!bVar1) goto LAB_0012ffd8;
        iVar5 = local_30 * 0x3c;
      }
      iVar5 = local_2c * 0xe10 + iVar5;
      iVar3 = -iVar5;
      if (iVar2 != 0x2d) {
        iVar3 = iVar5;
      }
      this->_offset = iVar3;
      c = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(c);
      if (!bVar1) {
        return true;
      }
    }
  }
LAB_0012ffd8:
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_off_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int sign = pig.peek ();
  if (sign == '+' || sign == '-')
  {
    pig.skipN (1);

    int hour {0};
    int minute {0};

    if (parse_off_hour (pig, hour))
    {
      if (pig.skip (':'))
      {
        if (! parse_off_minute (pig, minute))
        {
          pig.restoreTo (checkpoint);
          return false;
        }
      }

      _offset = (hour * 3600) + (minute * 60);
      if (sign == '-')
        _offset = - _offset;

      if (! unicodeLatinDigit (pig.peek ()))
        return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}